

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int BackwardRefsWithLocalCache(uint32_t *argb,int cache_bits,VP8LBackwardRefs *refs)

{
  int iVar1;
  PixOrCopy PVar2;
  VP8LBackwardRefs *in_RDX;
  int k;
  int ix;
  uint32_t argb_literal;
  PixOrCopy *v;
  VP8LRefsCursor c;
  VP8LColorCache hashers;
  int pixel_index;
  VP8LColorCache *in_stack_ffffffffffffff88;
  VP8LColorCache *pVVar3;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  VP8LRefsCursor local_50;
  int local_24;
  int local_4;
  
  local_24 = 0;
  VP8LRefsCursorInit(&local_50,in_RDX);
  iVar1 = VP8LColorCacheInit(in_stack_ffffffffffffff88,0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    while (iVar1 = VP8LRefsCursorOk(&local_50), pVVar3 = (VP8LColorCache *)local_50.cur_pos,
          iVar1 != 0) {
      iVar1 = PixOrCopyIsLiteral(local_50.cur_pos);
      if (iVar1 == 0) {
        for (in_stack_ffffffffffffff94 = 0;
            in_stack_ffffffffffffff94 <
            (int)(uint)*(ushort *)((long)&((PixOrCopy *)pVVar3)->mode + 2);
            in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
          local_24 = local_24 + 1;
          VP8LColorCacheInsert
                    ((VP8LColorCache *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                     ,(uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
        }
      }
      else {
        iVar1 = VP8LColorCacheContains
                          ((VP8LColorCache *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
        if (iVar1 < 0) {
          VP8LColorCacheInsert
                    ((VP8LColorCache *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                     ,(uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
        }
        else {
          PVar2 = PixOrCopyCreateCacheIdx(iVar1);
          pVVar3->colors = (uint32_t *)PVar2;
          in_stack_ffffffffffffff88 = pVVar3;
        }
        local_24 = local_24 + 1;
      }
      VP8LRefsCursorNext((VP8LRefsCursor *)0x1990d3);
    }
    VP8LColorCacheClear((VP8LColorCache *)0x1990e2);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int BackwardRefsWithLocalCache(const uint32_t* const argb,
                                      int cache_bits,
                                      VP8LBackwardRefs* const refs) {
  int pixel_index = 0;
  VP8LColorCache hashers;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  if (!VP8LColorCacheInit(&hashers, cache_bits)) return 0;

  while (VP8LRefsCursorOk(&c)) {
    PixOrCopy* const v = c.cur_pos;
    if (PixOrCopyIsLiteral(v)) {
      const uint32_t argb_literal = v->argb_or_distance;
      const int ix = VP8LColorCacheContains(&hashers, argb_literal);
      if (ix >= 0) {
        // hashers contains argb_literal
        *v = PixOrCopyCreateCacheIdx(ix);
      } else {
        VP8LColorCacheInsert(&hashers, argb_literal);
      }
      ++pixel_index;
    } else {
      // refs was created without local cache, so it can not have cache indexes.
      int k;
      assert(PixOrCopyIsCopy(v));
      for (k = 0; k < v->len; ++k) {
        VP8LColorCacheInsert(&hashers, argb[pixel_index++]);
      }
    }
    VP8LRefsCursorNext(&c);
  }
  VP8LColorCacheClear(&hashers);
  return 1;
}